

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O0

void Hacl_GenericField32_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  long lVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  uint32_t auStack_290 [2];
  uint32_t *local_288;
  uint32_t *local_280;
  uint32_t *local_278;
  uint32_t *local_270;
  uint32_t *local_268;
  uint32_t *local_260;
  uint32_t *local_258;
  uint32_t *ctx_n_9;
  uint32_t *a_bits_l_1;
  uint32_t local_240;
  uint32_t bits_l32_1;
  uint32_t bits_l;
  uint32_t k2;
  uint32_t *ctx_n_13;
  uint32_t *ctx_n_12;
  uint32_t *ctx_n_11;
  uint32_t *ctx_n_10;
  uint32_t i0;
  uint32_t i_3;
  unsigned_long __vla_expr5;
  uint32_t *ctx_r2_1;
  uint32_t *ctx_n_8;
  uint32_t *a_bits_l;
  uint32_t local_1e8;
  uint32_t bits_l32;
  uint32_t bits_c;
  uint32_t i_2;
  uint32_t *ctx_n_7;
  uint32_t *t2_6;
  uint32_t *ctx_n1_6;
  uint32_t *t11_6;
  uint32_t *ctx_n_6;
  uint32_t *t2_5;
  uint32_t *ctx_n1_5;
  uint32_t *t11_5;
  uint32_t *ctx_n_5;
  uint32_t *t2_4;
  uint32_t *ctx_n1_4;
  uint32_t *t11_4;
  uint32_t *ctx_n_4;
  uint32_t *t2_3;
  uint32_t *ctx_n1_3;
  uint32_t *t11_3;
  uint32_t *ctx_n_3;
  uint32_t *t2_2;
  uint32_t *ctx_n1_2;
  uint32_t *t11_2;
  uint32_t *ctx_n_2;
  uint32_t *t2_1;
  uint32_t *ctx_n1_1;
  uint32_t *t11_1;
  uint32_t *ctx_n_1;
  uint32_t *t2;
  uint32_t *ctx_n1;
  uint32_t *t11;
  uint32_t *puStack_f8;
  uint32_t i_1;
  uint32_t *ctx_r20;
  uint32_t *ctx_n0_2;
  uint32_t *t1;
  uint32_t *t0;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  uint32_t local_b4;
  uint32_t *puStack_b0;
  uint32_t bLen;
  uint32_t *ctx_n0;
  uint32_t *ctx_n0_1;
  uint local_98;
  uint32_t bit;
  uint32_t tmp;
  uint32_t j;
  uint32_t i1;
  uint32_t i;
  uint32_t *ctx_r2;
  uint32_t *ctx_n;
  unsigned_long __vla_expr1;
  ulong local_68;
  unsigned_long __vla_expr0;
  ulong local_58;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1;
  uint32_t len1;
  uint32_t *resM_local;
  uint32_t *b_local;
  uint32_t bBits_local;
  uint32_t *aM_local;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k_local;
  
  auStack_290[0] = 0x204077;
  auStack_290[1] = 0;
  k1.r2._4_4_ = Hacl_GenericField32_field_get_len(k);
  local_58 = *(ulong *)k;
  k1._0_8_ = k->n;
  k1.n = *(uint32_t **)&k->mu;
  k1._16_8_ = k->r2;
  if (0x3fffffffffffffff < (local_58 & 0xffffffff)) {
    auStack_290[0] = 0x2040c9;
    auStack_290[1] = 0;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
           ,0x1c1);
    auStack_290[0] = 0x2040d3;
    auStack_290[1] = 0;
    exit(0xfd);
  }
  local_68 = local_58 & 0xffffffff;
  lVar1 = -(local_68 * 4 + 0xf & 0xfffffffffffffff0);
  puVar9 = (uint32_t *)((long)&local_288 + lVar1);
  uVar7 = local_58 & 0xffffffff;
  local_260 = puVar9;
  __vla_expr0 = (unsigned_long)&local_288;
  *(undefined8 *)((long)auStack_290 + lVar1) = 0x20410f;
  memset(puVar9,0,uVar7 << 2);
  puVar11 = local_260;
  uVar7 = local_58 & 0xffffffff;
  *(undefined8 *)((long)auStack_290 + lVar1) = 0x204128;
  memcpy(puVar11,aM,uVar7 << 2);
  if (bBits < 200) {
    if (0x3fffffffffffffff < (ulong)(k1.r2._4_4_ * 2)) {
      *(undefined8 *)((long)auStack_290 + lVar1) = 0x204168;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x1c7);
      *(undefined8 *)((long)auStack_290 + lVar1) = 0x204172;
      exit(0xfd);
    }
    ctx_n = (uint32_t *)(ulong)(k1.r2._4_4_ * 2);
    puVar10 = (uint32_t *)((long)puVar9 - ((long)ctx_n * 4 + 0xfU & 0xfffffffffffffff0));
    uVar4 = k1.r2._4_4_ * 2;
    local_268 = puVar10;
    __vla_expr1 = (unsigned_long)puVar9;
    puVar10[-2] = 0x2041b7;
    puVar10[-1] = 0;
    memset(puVar10,0,(ulong)uVar4 << 2);
    uVar3 = k1._0_8_;
    puVar11 = local_268;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2041d0;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    uVar3 = k1._16_8_;
    puVar11 = local_268 + k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2041f3;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    uVar4 = k1.r2._4_4_;
    puVar11 = local_268;
    ctx_r2 = local_268;
    puVar9 = local_268 + k1.r2._4_4_;
    uVar2 = (uint32_t)k1.n;
    _i1 = puVar9;
    puVar10[-2] = 0x204223;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar4,puVar11,uVar2,puVar9,resM);
    for (j = 0; uVar2 = k1.r2._4_4_, puVar9 = local_260, puVar11 = local_268, j < bBits; j = j + 1)
    {
      tmp = j >> 5;
      bit = j & 0x1f;
      local_98 = b[tmp];
      ctx_n0_1._4_4_ = local_98 >> (sbyte)bit & 1;
      if (ctx_n0_1._4_4_ != 0) {
        ctx_n0 = local_268;
        uVar5 = (uint32_t)k1.n;
        puVar10[-2] = 0x2042bc;
        puVar10[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar11,uVar5,resM,puVar9,resM);
      }
      uVar5 = k1.r2._4_4_;
      puVar9 = local_260;
      puVar11 = local_268;
      puStack_b0 = local_268;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x2042e6;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar11,uVar2,puVar9,puVar9);
    }
  }
  else {
    if (bBits == 0) {
      local_b4 = 1;
    }
    else {
      local_b4 = (bBits - 1 >> 5) + 1;
    }
    if (0x3fffffffffffffff < (ulong)(k1.r2._4_4_ * 2)) {
      *(undefined8 *)((long)auStack_290 + lVar1) = 0x20435d;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x1e9);
      *(undefined8 *)((long)auStack_290 + lVar1) = 0x204367;
      exit(0xfd);
    }
    __vla_expr3 = (unsigned_long)(k1.r2._4_4_ * 2);
    puVar10 = (uint32_t *)((long)puVar9 - (__vla_expr3 * 4 + 0xf & 0xfffffffffffffff0));
    uVar4 = k1.r2._4_4_ * 2;
    local_270 = puVar10;
    __vla_expr2 = (unsigned_long)puVar9;
    puVar10[-2] = 0x2043b2;
    puVar10[-1] = 0;
    memset(puVar10,0,(ulong)uVar4 << 2);
    uVar3 = k1._0_8_;
    puVar11 = local_270;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2043cb;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    uVar3 = k1._16_8_;
    puVar11 = local_270 + k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2043ee;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    if (0x3fffffffffffffff < (ulong)(k1.r2._4_4_ << 4)) {
      puVar10[-2] = 0x20441f;
      puVar10[-1] = 0;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x1ee);
      puVar10[-2] = 0x204429;
      puVar10[-1] = 0;
      exit(0xfd);
    }
    __vla_expr4 = (unsigned_long)(k1.r2._4_4_ << 4);
    puVar10 = puVar10 + -__vla_expr4;
    uVar4 = k1.r2._4_4_ << 4;
    local_278 = puVar10;
    puVar10[-2] = 0x204466;
    puVar10[-1] = 0;
    memset(puVar10,0,(ulong)uVar4 << 2);
    if (0x3fffffffffffffff < (ulong)k1.r2._4_4_) {
      puVar10[-2] = 0x204492;
      puVar10[-1] = 0;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x1f1);
      puVar10[-2] = 0x20449c;
      puVar10[-1] = 0;
      exit(0xfd);
    }
    t0 = (uint32_t *)(ulong)k1.r2._4_4_;
    puVar10 = (uint32_t *)((long)puVar10 - ((long)t0 * 4 + 0xfU & 0xfffffffffffffff0));
    uVar7 = (ulong)k1.r2._4_4_;
    local_280 = puVar10;
    puVar10[-2] = 0x2044d6;
    puVar10[-1] = 0;
    memset(puVar10,0,uVar7 << 2);
    uVar4 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_278;
    t1 = local_278;
    ctx_n0_2 = local_278 + k1.r2._4_4_;
    ctx_r20 = local_270;
    puVar6 = local_270 + k1.r2._4_4_;
    uVar2 = (uint32_t)k1.n;
    puStack_f8 = puVar6;
    puVar10[-2] = 0x204534;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar4,puVar9,uVar2,puVar6,puVar11);
    puVar9 = ctx_n0_2;
    puVar11 = local_260;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204550;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_280;
    t11._4_4_ = 0;
    puVar6 = local_278 + k1.r2._4_4_;
    t2 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n1 = puVar6;
    puVar10[-2] = 0x2045ac;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar9,uVar2,puVar6,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2045e0;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar6 = local_260;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar8 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_1 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n_1 = puVar8;
    puVar10[-2] = 0x20463b;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,puVar6,puVar8,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x20466f;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar6 = local_278 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_1 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_1 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x2046d0;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar9,uVar2,puVar6,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204704;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar6 = local_260;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar8 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_2 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n_2 = puVar8;
    puVar10[-2] = 0x20475f;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,puVar6,puVar8,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204793;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar6 = local_278 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_2 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_2 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x2047f4;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar9,uVar2,puVar6,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204828;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar6 = local_260;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar8 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_3 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n_3 = puVar8;
    puVar10[-2] = 0x204883;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,puVar6,puVar8,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2048b7;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar6 = local_278 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_3 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_3 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x204918;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar9,uVar2,puVar6,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x20494c;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar6 = local_260;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar8 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_4 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n_4 = puVar8;
    puVar10[-2] = 0x2049a7;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,puVar6,puVar8,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2049db;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar6 = local_278 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_4 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_4 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x204a3c;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar9,uVar2,puVar6,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204a70;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar6 = local_260;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar8 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_5 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n_5 = puVar8;
    puVar10[-2] = 0x204acb;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,puVar6,puVar8,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204aff;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar6 = local_278 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_5 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_5 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x204b60;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar9,uVar2,puVar6,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204b94;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar6 = local_260;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar8 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_6 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n_6 = puVar8;
    puVar10[-2] = 0x204bef;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,puVar6,puVar8,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204c23;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar6 = local_278 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_6 = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_6 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x204c84;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar9,uVar2,puVar6,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204cb8;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar5 = k1.r2._4_4_;
    puVar6 = local_260;
    puVar9 = local_270;
    puVar11 = local_280;
    puVar8 = local_278 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    _bits_c = local_270;
    uVar2 = (uint32_t)k1.n;
    ctx_n_7 = puVar8;
    puVar10[-2] = 0x204d13;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,puVar6,puVar8,puVar11);
    puVar11 = local_280;
    puVar9 = local_278 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x204d47;
    puVar10[-1] = 0;
    memcpy(puVar9,puVar11,uVar7 << 2);
    uVar4 = k1.r2._4_4_;
    uVar2 = local_b4;
    puVar11 = local_270;
    t11._4_4_ = t11._4_4_ + 1;
    if ((bBits & 3) == 0) {
      ctx_r2_1 = local_270;
      puVar9 = local_270 + k1.r2._4_4_;
      uVar2 = (uint32_t)k1.n;
      __vla_expr5 = (unsigned_long)puVar9;
      puVar10[-2] = 0x204e18;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar4,puVar11,uVar2,puVar9,resM);
    }
    else {
      bits_l32 = bBits & 0xfffffffc;
      puVar10[-2] = 0x204d8c;
      puVar10[-1] = 0;
      a_bits_l._4_4_ = Hacl_Bignum_Lib_bn_get_bits_u32(uVar2,b,bBits & 0xfffffffc,4);
      puVar11 = local_278 + a_bits_l._4_4_ * k1.r2._4_4_;
      uVar7 = (ulong)k1.r2._4_4_;
      ctx_n_8 = puVar11;
      local_1e8 = a_bits_l._4_4_;
      puVar10[-2] = 0x204dda;
      puVar10[-1] = 0;
      memcpy(resM,puVar11,uVar7 << 2);
    }
    if (0x3fffffffffffffff < (ulong)k1.r2._4_4_) {
      puVar10[-2] = 0x204e46;
      puVar10[-1] = 0;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x214);
      puVar10[-2] = 0x204e50;
      puVar10[-1] = 0;
      exit(0xfd);
    }
    _i0 = (ulong)k1.r2._4_4_;
    puVar10 = (uint32_t *)((long)puVar10 - (_i0 * 4 + 0xf & 0xfffffffffffffff0));
    uVar7 = (ulong)k1.r2._4_4_;
    local_288 = puVar10;
    puVar10[-2] = 0x204e8a;
    puVar10[-1] = 0;
    memset(puVar10,0,uVar7 << 2);
    for (ctx_n_10._4_4_ = 0; uVar2 = k1.r2._4_4_, puVar11 = local_270, ctx_n_10._4_4_ < bBits >> 2;
        ctx_n_10._4_4_ = ctx_n_10._4_4_ + 1) {
      ctx_n_10._0_4_ = 0;
      ctx_n_11 = local_270;
      uVar5 = (uint32_t)k1.n;
      puVar10[-2] = 0x204edc;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar11,uVar5,resM,resM);
      uVar5 = k1.r2._4_4_;
      puVar11 = local_270;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_12 = local_270;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x204f13;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar11,uVar2,resM,resM);
      uVar5 = k1.r2._4_4_;
      puVar11 = local_270;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_13 = local_270;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x204f4a;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar11,uVar2,resM,resM);
      uVar5 = k1.r2._4_4_;
      puVar11 = local_270;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      _bits_l = local_270;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x204f81;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar11,uVar2,resM,resM);
      uVar2 = local_b4;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      uVar5 = ((bBits - (bBits & 3)) + ctx_n_10._4_4_ * -4) - 4;
      bits_l32_1 = uVar5;
      puVar10[-2] = 0x204fcb;
      puVar10[-1] = 0;
      a_bits_l_1._4_4_ = Hacl_Bignum_Lib_bn_get_bits_u32(uVar2,b,uVar5,4);
      puVar11 = local_288;
      puVar9 = local_278 + a_bits_l_1._4_4_ * k1.r2._4_4_;
      uVar7 = (ulong)k1.r2._4_4_;
      ctx_n_9 = puVar9;
      local_240 = a_bits_l_1._4_4_;
      puVar10[-2] = 0x20501c;
      puVar10[-1] = 0;
      memcpy(puVar11,puVar9,uVar7 << 2);
      uVar5 = k1.r2._4_4_;
      puVar9 = local_270;
      puVar11 = local_288;
      local_258 = local_270;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x20504b;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar5,puVar9,uVar2,resM,puVar11,resM);
    }
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 32U;
      uint32_t j = i % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      if (!(bit == 0U))
      {
        uint32_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i, 4U);
      uint32_t bits_l32 = bits_c;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      uint32_t bits_l32 = bits_l;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}